

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

int lj_carith_op(lua_State *L,MMS mm)

{
  int iVar1;
  undefined1 local_88 [8];
  CDArith ca;
  CTState *cts;
  MMS mm_local;
  lua_State *L_local;
  CTState *cts_1;
  
  ca.ct[1] = *(CType **)((L->glref).ptr64 + 0x180);
  ((CTState *)ca.ct[1])->L = L;
  iVar1 = carith_checkarg(L,(CTState *)ca.ct[1],(CDArith *)local_88);
  if ((((iVar1 == 0) || (mm == MM_FAST)) || (mm == MM_concat)) ||
     ((iVar1 = carith_int64(L,(CTState *)ca.ct[1],(CDArith *)local_88,mm), iVar1 == 0 &&
      (iVar1 = carith_ptr(L,(CTState *)ca.ct[1],(CDArith *)local_88,mm), iVar1 == 0)))) {
    L_local._4_4_ = lj_carith_meta(L,(CTState *)ca.ct[1],(CDArith *)local_88,mm);
  }
  else {
    *(TValue *)((L->glref).ptr64 + 0xf0) = L->top[-1];
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

int lj_carith_op(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CDArith ca;
  if (carith_checkarg(L, cts, &ca) && mm != MM_len && mm != MM_concat) {
    if (carith_int64(L, cts, &ca, mm) || carith_ptr(L, cts, &ca, mm)) {
      copyTV(L, &G(L)->tmptv2, L->top-1);  /* Remember for trace recorder. */
      return 1;
    }
  }
  return lj_carith_meta(L, cts, &ca, mm);
}